

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cc
# Opt level: O0

int CBS_get_utf8(CBS *cbs,uint32_t *out)

{
  int iVar1;
  ulong local_40;
  size_t i;
  size_t len;
  uint local_28;
  uint32_t lower_bound;
  uint32_t v;
  uint8_t c;
  uint32_t *out_local;
  CBS *cbs_local;
  
  _v = out;
  out_local = (uint32_t *)cbs;
  iVar1 = CBS_get_u8(cbs,(uint8_t *)((long)&lower_bound + 3));
  if (iVar1 == 0) {
    cbs_local._4_4_ = 0;
  }
  else if (lower_bound._3_1_ < 0x80) {
    *_v = (uint)lower_bound._3_1_;
    cbs_local._4_4_ = 1;
  }
  else {
    if ((lower_bound._3_1_ & 0xe0) == 0xc0) {
      local_28 = lower_bound._3_1_ & 0x1f;
      i = 1;
      len._4_4_ = 0x80;
    }
    else if ((lower_bound._3_1_ & 0xf0) == 0xe0) {
      local_28 = lower_bound._3_1_ & 0xf;
      i = 2;
      len._4_4_ = 0x800;
    }
    else {
      if ((lower_bound._3_1_ & 0xf8) != 0xf0) {
        return 0;
      }
      local_28 = lower_bound._3_1_ & 7;
      i = 3;
      len._4_4_ = 0x10000;
    }
    for (local_40 = 0; local_40 < i; local_40 = local_40 + 1) {
      iVar1 = CBS_get_u8((CBS *)out_local,(uint8_t *)((long)&lower_bound + 3));
      if ((iVar1 == 0) || ((lower_bound._3_1_ & 0xc0) != 0x80)) {
        return 0;
      }
      local_28 = lower_bound._3_1_ & 0x3f | local_28 << 6;
    }
    iVar1 = is_valid_code_point(local_28);
    if ((iVar1 == 0) || (local_28 < len._4_4_)) {
      cbs_local._4_4_ = 0;
    }
    else {
      *_v = local_28;
      cbs_local._4_4_ = 1;
    }
  }
  return cbs_local._4_4_;
}

Assistant:

int CBS_get_utf8(CBS *cbs, uint32_t *out) {
  uint8_t c;
  if (!CBS_get_u8(cbs, &c)) {
    return 0;
  }
  if (c <= 0x7f) {
    *out = c;
    return 1;
  }
  uint32_t v, lower_bound;
  size_t len;
  if ((c & TOP_BITS(3)) == TOP_BITS(2)) {
    v = c & BOTTOM_BITS(5);
    len = 1;
    lower_bound = 0x80;
  } else if ((c & TOP_BITS(4)) == TOP_BITS(3)) {
    v = c & BOTTOM_BITS(4);
    len = 2;
    lower_bound = 0x800;
  } else if ((c & TOP_BITS(5)) == TOP_BITS(4)) {
    v = c & BOTTOM_BITS(3);
    len = 3;
    lower_bound = 0x10000;
  } else {
    return 0;
  }
  for (size_t i = 0; i < len; i++) {
    if (!CBS_get_u8(cbs, &c) ||
        (c & TOP_BITS(2)) != TOP_BITS(1)) {
      return 0;
    }
    v <<= 6;
    v |= c & BOTTOM_BITS(6);
  }
  if (!is_valid_code_point(v) ||
      v < lower_bound) {
    return 0;
  }
  *out = v;
  return 1;
}